

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_tri_uv_bounding_sphere3(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *center,REF_DBL *radius)

{
  uint uVar1;
  double dVar2;
  REF_DBL RVar3;
  REF_INT sens;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_INT local_9c;
  double local_98;
  double local_90;
  REF_DBL local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,&local_48,&local_9c);
  if (uVar1 == 0) {
    uVar1 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,&local_58,&local_9c);
    if (uVar1 == 0) {
      uVar1 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,&local_68,&local_9c);
      if (uVar1 == 0) {
        local_98 = local_58;
        local_78 = local_68;
        *center = (local_48 + local_58 + local_68) / 3.0;
        local_90 = local_60;
        center[1] = (local_40 + local_50 + local_60) / 3.0;
        *radius = 0.0;
        dVar2 = (local_40 - center[1]) * (local_40 - center[1]) +
                (local_48 - *center) * (local_48 - *center);
        local_80 = local_50;
        if (dVar2 < 0.0) {
          local_88 = local_48;
          local_70 = local_40;
          dVar2 = sqrt(dVar2);
          local_48 = local_88;
          local_40 = local_70;
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        if (0.0 <= dVar2) {
          dVar2 = (local_40 - center[1]) * (local_40 - center[1]) +
                  (local_48 - *center) * (local_48 - *center);
          if (dVar2 < 0.0) {
            RVar3 = sqrt(dVar2);
          }
          else {
            RVar3 = SQRT(dVar2);
          }
        }
        else {
          RVar3 = *radius;
        }
        *radius = RVar3;
        dVar2 = (local_80 - center[1]) * (local_80 - center[1]) +
                (local_98 - *center) * (local_98 - *center);
        if (dVar2 < 0.0) {
          local_88 = RVar3;
          dVar2 = sqrt(dVar2);
          RVar3 = local_88;
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        if (RVar3 <= dVar2) {
          dVar2 = (local_80 - center[1]) * (local_80 - center[1]) +
                  (local_98 - *center) * (local_98 - *center);
          if (dVar2 < 0.0) {
            RVar3 = sqrt(dVar2);
          }
          else {
            RVar3 = SQRT(dVar2);
          }
        }
        else {
          RVar3 = *radius;
        }
        *radius = RVar3;
        dVar2 = (local_90 - center[1]) * (local_90 - center[1]) +
                (local_78 - *center) * (local_78 - *center);
        if (dVar2 < 0.0) {
          local_98 = RVar3;
          dVar2 = sqrt(dVar2);
          RVar3 = local_98;
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        if (RVar3 <= dVar2) {
          dVar2 = (local_90 - center[1]) * (local_90 - center[1]) +
                  (local_78 - *center) * (local_78 - *center);
          if (dVar2 < 0.0) {
            RVar3 = sqrt(dVar2);
          }
          else {
            RVar3 = SQRT(dVar2);
          }
        }
        else {
          RVar3 = *radius;
        }
        *radius = RVar3;
        uVar1 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xf63,"ref_geom_tri_uv_bounding_sphere3",(ulong)uVar1,"uv2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf61,
             "ref_geom_tri_uv_bounding_sphere3",(ulong)uVar1,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf5f,
           "ref_geom_tri_uv_bounding_sphere3",(ulong)uVar1,"uv0");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_sphere3(REF_GEOM ref_geom,
                                                    REF_INT *nodes,
                                                    REF_DBL *center,
                                                    REF_DBL *radius) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");

  center[0] = (uv0[0] + uv1[0] + uv2[0]) / 3.0;
  center[1] = (uv0[1] + uv1[1] + uv2[1]) / 3.0;

  *radius = 0.0;
  *radius = MAX(*radius,
                sqrt(pow(uv0[0] - center[0], 2) + pow(uv0[1] - center[1], 2)));
  *radius = MAX(*radius,
                sqrt(pow(uv1[0] - center[0], 2) + pow(uv1[1] - center[1], 2)));
  *radius = MAX(*radius,
                sqrt(pow(uv2[0] - center[0], 2) + pow(uv2[1] - center[1], 2)));

  return REF_SUCCESS;
}